

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSetImplement.h
# Opt level: O0

void __thiscall
BitSetImplement<std::bitset<16000UL>,_KDefectiveRDS>::__init__
          (BitSetImplement<std::bitset<16000UL>,_KDefectiveRDS> *this,void *P,void *C)

{
  int local_34;
  int i;
  bitset<16000UL> *__C__;
  bitset<16000UL> *__P__;
  void *C_local;
  void *P_local;
  BitSetImplement<std::bitset<16000UL>,_KDefectiveRDS> *this_local;
  
  std::bitset<16000UL>::reset((bitset<16000UL> *)P);
  for (local_34 = 0; local_34 < (this->super_KDefectiveRDS).super_KDefectiveBase.size;
      local_34 = local_34 + 1) {
    std::bitset<16000UL>::set((bitset<16000UL> *)C,(long)local_34,true);
  }
  return;
}

Assistant:

void BitSetImplement<Bitset, Base>::__init__(void *P, void *C) {
	Bitset *__P__ = (Bitset*) P, *__C__ = (Bitset*) C;
	__P__ -> reset(); 
	for (int i = 0; i < size; i++) __C__ -> set(i);
}